

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  undefined8 unaff_RBX;
  undefined8 uVar6;
  bool bVar7;
  error_code ec;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28 [2];
  long *local_20;
  
  LOCK();
  bVar7 = (this->state)._M_i == OPENED;
  if (bVar7) {
    (this->state)._M_i = CONNECTING;
  }
  UNLOCK();
  if (!bVar7) {
    return (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),(this->state)._M_i == CONNECTED);
  }
  local_28[0] = 0;
  local_20 = (long *)std::_V2::system_category();
  asio::detail::reactive_socket_service<asio::ip::tcp>::bind
            ((this->acceptor_).impl_.service_,(int)this + 0x38,(sockaddr *)&this->endpoint_,
             (socklen_t)local_28);
  iVar5 = (int)CONCAT71((int7)((ulong)local_28 >> 8),local_28[0] == 0);
  if (local_28[0] == 0) {
    LOCK();
    (this->state)._M_i = CONNECTED;
    UNLOCK();
    return iVar5;
  }
  LOCK();
  (this->state)._M_i = OPENED;
  UNLOCK();
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"acceptor error","");
  (**(code **)(*local_20 + 0x20))(&local_68,local_20,local_28[0]);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    uVar6 = local_48.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_68._M_string_length + local_48._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar6 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_48._M_string_length <= (ulong)uVar6) {
      pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_68,0,0,local_48._M_dataplus._M_p,local_48._M_string_length);
      goto LAB_003c390f;
    }
  }
  pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_48,local_68._M_dataplus._M_p,local_68._M_string_length);
LAB_003c390f:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar1) {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_88._M_dataplus._M_p = (pointer)paVar3;
  }
  local_88._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  logger(this,0,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

bool TcpAcceptor::connect()
{
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        std::error_code ec;
        acceptor_.bind(endpoint_, ec);
        if (ec) {
            state = AcceptingStates::OPENED;
            logger(0, std::string("acceptor error") + ec.message());
            return false;
        }
        state = AcceptingStates::CONNECTED;
        return true;
    }
    return (state == AcceptingStates::CONNECTED);
}